

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udataswp.cpp
# Opt level: O0

int32_t udata_swapInvStringBlock_63
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  UBool UVar1;
  bool bVar2;
  int local_44;
  int32_t stringsLength;
  char *inChars;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    ds_local._4_4_ = 0;
  }
  else if (((ds == (UDataSwapper *)0x0) || ((inData == (void *)0x0 || (length < 0)))) ||
          ((local_44 = length, 0 < length && (outData == (void *)0x0)))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    ds_local._4_4_ = 0;
  }
  else {
    while( true ) {
      bVar2 = false;
      if (0 < local_44) {
        bVar2 = *(char *)((long)inData + (long)(local_44 + -1)) != '\0';
      }
      if (!bVar2) break;
      local_44 = local_44 + -1;
    }
    (*ds->swapInvChars)(ds,inData,local_44,outData,pErrorCode);
    if ((inData != outData) && (local_44 < length)) {
      memcpy((void *)((long)outData + (long)local_44),(void *)((long)inData + (long)local_44),
             (long)(length - local_44));
    }
    UVar1 = U_SUCCESS(*pErrorCode);
    ds_local._4_4_ = length;
    if (UVar1 == '\0') {
      ds_local._4_4_ = 0;
    }
  }
  return ds_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
udata_swapInvStringBlock(const UDataSwapper *ds,
                         const void *inData, int32_t length, void *outData,
                         UErrorCode *pErrorCode) {
    const char *inChars;
    int32_t stringsLength;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<0 || (length>0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* reduce the strings length to not include bytes after the last NUL */
    inChars=(const char *)inData;
    stringsLength=length;
    while(stringsLength>0 && inChars[stringsLength-1]!=0) {
        --stringsLength;
    }

    /* swap up to the last NUL */
    ds->swapInvChars(ds, inData, stringsLength, outData, pErrorCode);

    /* copy the bytes after the last NUL */
    if(inData!=outData && length>stringsLength) {
        uprv_memcpy((char *)outData+stringsLength, inChars+stringsLength, length-stringsLength);
    }

    /* return the length including padding bytes */
    if(U_SUCCESS(*pErrorCode)) {
        return length;
    } else {
        return 0;
    }
}